

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

void __thiscall
hungarian_algorithm::HungarianSolver<int,unsigned_long,std::less<int>>::
solve<boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>>
          (HungarianSolver<int,unsigned_long,std::less<int>> *this,
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          *cost_function)

{
  char cVar1;
  
  if ((*(long *)this != 0) && (*(long *)(this + 8) != 0)) {
    copyAndNormalizeCosts<boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>>
              (this,cost_function);
    while (cVar1 = hungarian_algorithm::HungarianSolverBase::areAllColumnsCovered(), cVar1 == '\0')
    {
      while (cVar1 = hungarian_algorithm::HungarianSolverBase::findAssignment(), cVar1 == '\0') {
        HungarianSolver<int,_unsigned_long,_std::less<int>_>::subtractSmallestUncoveredElement
                  ((HungarianSolver<int,_unsigned_long,_std::less<int>_> *)this);
      }
    }
  }
  return;
}

Assistant:

void solve(const CostFunction& cost_function)
  {
    if (num_rows_ != 0 && num_cols_ != 0)
    {
      copyAndNormalizeCosts<CostFunction>(cost_function);
      while (!areAllColumnsCovered())
      {
        while (!findAssignment())
        {
          // No zeros found => generate more zeros by subtracting smallest remaining element:
          subtractSmallestUncoveredElement();
        }
      }
    }
  }